

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaStr.c
# Opt level: O2

void Str_NtkBalanceMulti2
               (Gia_Man_t *pNew,Str_Ntk_t *p,Str_Obj_t *pObj,Vec_Int_t *vDelay,int nLutSize)

{
  int iLit1;
  int iVar1;
  uint i;
  uint uVar2;
  
  uVar2 = *(uint *)pObj;
  pObj->iCopy = (uint)((uVar2 & 0xf) == 3);
  for (i = 0; i < uVar2 >> 4; i = i + 1) {
    iVar1 = pObj->iCopy;
    iLit1 = Str_ObjFaninCopy(p,pObj,i);
    if ((uVar2 & 0xf) == 3) {
      iVar1 = Gia_ManHashAnd(pNew,iVar1,iLit1);
    }
    else {
      iVar1 = Gia_ManHashXorReal(pNew,iVar1,iLit1);
    }
    pObj->iCopy = iVar1;
    iVar1 = Abc_Lit2Var(iVar1);
    Str_ObjDelay(pNew,iVar1,nLutSize,vDelay);
    uVar2 = *(uint *)pObj;
  }
  return;
}

Assistant:

void Str_NtkBalanceMulti2( Gia_Man_t * pNew, Str_Ntk_t * p, Str_Obj_t * pObj, Vec_Int_t * vDelay, int nLutSize )
{
    int k;
    pObj->iCopy = (pObj->Type == STR_AND);
    for ( k = 0; k < (int)pObj->nFanins; k++ )
    {
        if ( pObj->Type == STR_AND )
            pObj->iCopy = Gia_ManHashAnd( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        else
            pObj->iCopy = Gia_ManHashXorReal( pNew, pObj->iCopy, Str_ObjFaninCopy(p, pObj, k) );
        Str_ObjDelay( pNew, Abc_Lit2Var(pObj->iCopy), nLutSize, vDelay );
    }
}